

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::writeAssociativeContainer<QMap<QString,QMap<QString,QVariant>>>
          (QDataStream *s,QMap<QString,_QMap<QString,_QVariant>_> *c)

{
  QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
  *pQVar1;
  QDataStream *pQVar2;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  size_t sVar5;
  _Rb_tree_node_base *p_Var6;
  
  pQVar1 = (c->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
                 *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  if ((long)sVar5 < 0xfffffffe) {
    iVar4 = (int)sVar5;
  }
  else {
    if (0x15 < *(int *)(s + 0x18)) {
      pQVar2 = (QDataStream *)QDataStream::operator<<(s,-2);
      QDataStream::operator<<(pQVar2,sVar5);
      goto LAB_0011612b;
    }
    if (sVar5 != 0xfffffffe) {
      QDataStream::setStatus((Status)s);
      return s;
    }
    iVar4 = -2;
  }
  QDataStream::operator<<(s,iVar4);
LAB_0011612b:
  pQVar1 = (c->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
                 *)0x0) {
    p_Var3 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var3 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var6 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
                 *)0x0) {
    p_Var6 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var3 != p_Var6; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pQVar2 = (QDataStream *)operator<<(s,(QString *)(p_Var3 + 1));
    writeAssociativeContainer<QMap<QString,QVariant>>
              (pQVar2,(QMap<QString,_QVariant> *)&p_Var3[1]._M_right);
  }
  return s;
}

Assistant:

QDataStream &writeAssociativeContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    auto it = c.constBegin();
    auto end = c.constEnd();
    while (it != end) {
        s << it.key() << it.value();
        ++it;
    }

    return s;
}